

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O3

void __thiscall chrono::utils::ChChaseCamera::Raise(ChChaseCamera *this,int val)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  
  if ((val != 0) && (this->m_state == Free)) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->m_loc).m_data[0];
    auVar1._8_8_ = 0x3f847ae147ae147b;
    auVar1._0_8_ = 0x3f847ae147ae147b;
    auVar1 = vmulpd_avx512vl(*(undefined1 (*) [16])(this->m_up).m_data,auVar1);
    dVar2 = (this->m_up).m_data[2] * 0.01;
    if (val < 0) {
      auVar3 = vmovhpd_avx(auVar3,(this->m_loc).m_data[1]);
      (this->m_loc).m_data[0] = auVar1._0_8_ + auVar3._0_8_;
      (this->m_loc).m_data[1] = auVar1._8_8_ + auVar3._8_8_;
      dVar2 = dVar2 + (this->m_loc).m_data[2];
    }
    else {
      auVar3 = vmovhpd_avx(auVar3,(this->m_loc).m_data[1]);
      auVar1 = vsubpd_avx(auVar3,auVar1);
      *(undefined1 (*) [16])(this->m_loc).m_data = auVar1;
      dVar2 = (this->m_loc).m_data[2] - dVar2;
    }
    (this->m_loc).m_data[2] = dVar2;
  }
  return;
}

Assistant:

void ChChaseCamera::Raise(int val) {
    if (val == 0 || m_state != Free)
        return;

    if (val < 0)
        m_loc += 0.01 * m_up;
    else
        m_loc -= 0.01 * m_up;
}